

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O2

int run_test_suite(TestSuite *suite,TestReporter *reporter)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = per_test_timeout_defined();
  if (iVar1 != 0) {
    validate_per_test_timeout_value();
  }
  setup_reporting(reporter);
  run_every_test(suite,reporter);
  if (reporter->total_failures == 0) {
    uVar2 = (uint)(reporter->total_exceptions != 0);
  }
  else {
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

int run_test_suite(TestSuite *suite, TestReporter *reporter)
{
    int success;
    if (per_test_timeout_defined())
    {
        validate_per_test_timeout_value();
    }

    setup_reporting(reporter);
    run_every_test(suite, reporter);
    success = (reporter->total_failures == 0) && (reporter->total_exceptions == 0);
    return success ? EXIT_SUCCESS : EXIT_FAILURE;
}